

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-option-parser.cc
# Opt level: O0

void __thiscall
OptionParser_ShortAndLongParam_Test::~OptionParser_ShortAndLongParam_Test
          (OptionParser_ShortAndLongParam_Test *this)

{
  OptionParser_ShortAndLongParam_Test *this_local;
  
  ~OptionParser_ShortAndLongParam_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OptionParser, ShortAndLongParam) {
  std::string param;
  OptionParser parser("prog", "desc");
  parser.AddOption('p', "param", "metavar", "help",
                   [&](const char* arg) { param += arg; });
  const char* args[] = {"prog name", "-p", "h", "--param", "el", "--param=lo"};
  parser.Parse(6, const_cast<char**>(args));
  EXPECT_EQ("hello", param);
}